

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

int __thiscall Instance::init(Instance *this,EVP_PKEY_CTX *ctx)

{
  this->relax_domains = false;
  this->vtype = 'I';
  this->binary = false;
  this->method = -3;
  this->ndims = 0;
  this->m = 0;
  return 0;
}

Assistant:

void Instance::init() {
	relax_domains = false;
	binary = false;
	method = -3;
	vtype = 'I';
	ndims = 0;
	m = 0;
}